

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckCudaOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  allocator<cmsys::RegularExpression> *paVar1;
  cmCTest *pcVar2;
  initializer_list<cmsys::RegularExpression> __l;
  initializer_list<cmsys::RegularExpression> __l_00;
  value_type_conflict1 vVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *pcVar9;
  reference pvVar10;
  pointer this_01;
  size_type sVar11;
  ulong uVar12;
  reference pvVar13;
  reference puVar14;
  RegularExpression *local_18b0;
  RegularExpression *local_1890;
  string local_1870 [32];
  string local_1850 [32];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1830;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1828;
  cmDuration local_1820;
  undefined1 local_1818 [8];
  ostringstream cmCTestLog_msg_3;
  size_type i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  string local_1678;
  RegularExpression *local_1658;
  RegularExpression *local_1650;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_1648;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_1640;
  RegularExpression *local_1638;
  RegularExpression *local_1630;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_1628;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_1620;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  pos_matcher;
  anon_class_8_1_898e5cf2_for__M_pred match_predicate;
  string local_1608;
  RegularExpression *local_15e8;
  value_type *line;
  string local_15d8 [4];
  int failure;
  undefined1 local_15b8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_1440 [32];
  undefined1 local_1420 [8];
  ostringstream cmCTestLog_msg_1;
  ulong local_12a8;
  size_type totalOutputSize;
  undefined1 local_1280 [8];
  ostringstream cmCTestLog_msg;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1108;
  time_point sttime;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonMemcheckOutput;
  RegularExpression local_10d8;
  RegularExpression local_1008;
  RegularExpression local_f38;
  RegularExpression local_e68;
  undefined1 local_d98 [24];
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
  false_positive_matchers;
  RegularExpression local_d60;
  RegularExpression local_c90;
  RegularExpression local_bc0;
  RegularExpression local_af0;
  RegularExpression local_a20;
  RegularExpression local_950;
  RegularExpression local_880;
  RegularExpression local_7b0;
  RegularExpression local_6e0;
  RegularExpression local_610;
  RegularExpression local_540;
  RegularExpression local_470;
  undefined1 local_3a0 [24];
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> matchers;
  RegularExpression leakExpr;
  RegularExpression memcheckLine;
  undefined1 local_1d0 [4];
  int defects;
  ostringstream ostr;
  value_type_conflict1 local_58;
  size_type cc;
  bool unlimitedOutput;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<int,_std::allocator<int>_> *results_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)results;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  cmsys::SystemTools::Split
            (str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  cc._3_1_ = 0;
  lVar6 = std::__cxx11::string::find((char *)str,0xd10e47);
  if ((lVar6 != -1) || ((this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize == 0)) {
    cc._3_1_ = 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__cxx11::string::clear();
  memcheckLine._204_4_ = 0;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)&leakExpr.progsize,"^========");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)
             &matchers.
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"== Leaked [0-9,]+ bytes at");
  cmsys::RegularExpression::RegularExpression(&local_d60,"== Malloc/Free error encountered: (.*)");
  cmsys::RegularExpression::RegularExpression
            (&local_c90,"== Program hit error ([^ ]*).* on CUDA API call to");
  cmsys::RegularExpression::RegularExpression
            (&local_bc0,"== Program hit ([^ ]*).* on CUDA API call to");
  cmsys::RegularExpression::RegularExpression(&local_af0,"== (Invalid .*) of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression(&local_a20,"== (Fatal UVM [CG]PU fault)");
  cmsys::RegularExpression::RegularExpression(&local_950,"== .* (Potential .* hazard detected)");
  cmsys::RegularExpression::RegularExpression(&local_880,"== .* (Race reported)");
  cmsys::RegularExpression::RegularExpression(&local_7b0,"== (Barrier error)");
  cmsys::RegularExpression::RegularExpression(&local_6e0,"== (Uninitialized .* memory read)");
  cmsys::RegularExpression::RegularExpression(&local_610,"== (Unused memory)");
  cmsys::RegularExpression::RegularExpression(&local_540,"== (Host API memory access error)");
  cmsys::RegularExpression::RegularExpression(&local_470,"== ([A-Z][a-z].*)");
  local_3a0._0_8_ = &local_d60;
  local_3a0._8_8_ = (char *)0xc;
  paVar1 = (allocator<cmsys::RegularExpression> *)
           ((long)&false_positive_matchers.
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cmsys::RegularExpression>::allocator(paVar1);
  __l_00._M_len = local_3a0._8_8_;
  __l_00._M_array = (iterator)local_3a0._0_8_;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
             (local_3a0 + 0x10),__l_00,paVar1);
  std::allocator<cmsys::RegularExpression>::~allocator
            ((allocator<cmsys::RegularExpression> *)
             ((long)&false_positive_matchers.
                     super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1890 = (RegularExpression *)local_3a0;
  do {
    local_1890 = local_1890 + -1;
    cmsys::RegularExpression::~RegularExpression(local_1890);
  } while (local_1890 != &local_d60);
  cmsys::RegularExpression::RegularExpression
            (&local_10d8,"== Error: No attachable process found.*timed-out");
  cmsys::RegularExpression::RegularExpression
            (&local_1008,"== Default timeout can be adjusted with --launch-timeout");
  cmsys::RegularExpression::RegularExpression
            (&local_f38,"== Error: Target application terminated before first instrumented API");
  cmsys::RegularExpression::RegularExpression
            (&local_e68,"== Tracking kernels launched by child processes requires");
  local_d98._0_8_ = &local_10d8;
  local_d98._8_8_ = (char *)0x4;
  paVar1 = (allocator<cmsys::RegularExpression> *)
           ((long)&nonMemcheckOutput.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cmsys::RegularExpression>::allocator(paVar1);
  __l._M_len = local_d98._8_8_;
  __l._M_array = (iterator)local_d98._0_8_;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
             (local_d98 + 0x10),__l,paVar1);
  std::allocator<cmsys::RegularExpression>::~allocator
            ((allocator<cmsys::RegularExpression> *)
             ((long)&nonMemcheckOutput.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_18b0 = (RegularExpression *)local_d98;
  do {
    local_18b0 = local_18b0 + -1;
    cmsys::RegularExpression::~RegularExpression(local_18b0);
  } while (local_18b0 != &local_10d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
  local_1108.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1280);
  poVar7 = std::operator<<((ostream *)local_1280,"Start test: ");
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  this_00 = (void *)std::ostream::operator<<(poVar7,sVar8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::ostringstream::str();
  pcVar9 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4a7,pcVar9,
               (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string((string *)&totalOutputSize);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1280);
  local_12a8 = 0;
  for (local_58 = 0; vVar3 = local_58,
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40), vVar3 < sVar8; local_58 = local_58 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1420);
    poVar7 = std::operator<<((ostream *)local_1420,"test line ");
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40,local_58);
    poVar7 = std::operator<<(poVar7,(string *)pvVar10);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x4ab,pcVar9,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string(local_1440);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1420);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40,local_58);
    bVar4 = cmsys::RegularExpression::find((RegularExpression *)&leakExpr.progsize,pvVar10);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_15b8);
      poVar7 = std::operator<<((ostream *)local_15b8,"cuda sanitizer line ");
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_40,local_58);
      poVar7 = std::operator<<(poVar7,(string *)pvVar10);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x4b0,pcVar9,
                   (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
      std::__cxx11::string::~string(local_15d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_15b8);
      line._4_4_ = 0xffffffff;
      local_15e8 = (RegularExpression *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,local_58);
      bVar4 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         &matchers.
                          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_15e8);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1608,"Memory leak",
                   (allocator<char> *)((long)&match_predicate.line + 7));
        sVar11 = FindOrAddWarning(this,&local_1608);
        line._4_4_ = (uint)sVar11;
        std::__cxx11::string::~string((string *)&local_1608);
        std::allocator<char>::~allocator((allocator<char> *)((long)&match_predicate.line + 7));
      }
      else {
        pos_matcher._M_current = local_15e8;
        local_1628._M_current =
             (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                       ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                         *)(local_3a0 + 0x10));
        local_1630 = (RegularExpression *)
                     std::
                     vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                     end((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          *)(local_3a0 + 0x10));
        local_1638 = pos_matcher._M_current;
        local_1620 = std::
                     find_if<__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(std::__cxx11::string_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&)::__0>
                               (local_1628,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 )local_1630,pos_matcher._M_current);
        local_1640._M_current =
             (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                         *)(local_3a0 + 0x10));
        bVar4 = __gnu_cxx::operator!=(&local_1620,&local_1640);
        if (bVar4) {
          local_1648._M_current =
               (RegularExpression *)
               std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
               begin((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                     (local_d98 + 0x10));
          local_1650 = (RegularExpression *)
                       std::
                       vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                       end((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                            *)(local_d98 + 0x10));
          local_1658 = pos_matcher._M_current;
          bVar4 = std::
                  any_of<__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(std::__cxx11::string_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&)::__0>
                            (local_1648,
                             (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                              )local_1650,
                             (anon_class_8_1_898e5cf2_for__M_pred)pos_matcher._M_current);
          if (!bVar4) {
            this_01 = __gnu_cxx::
                      __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                      ::operator->(&local_1620);
            cmsys::RegularExpression::match_abi_cxx11_(&local_1678,this_01,1);
            sVar11 = FindOrAddWarning(this,&local_1678);
            line._4_4_ = (uint)sVar11;
            std::__cxx11::string::~string((string *)&local_1678);
          }
        }
      }
      if (-1 < (int)line._4_4_) {
        poVar7 = std::operator<<((ostream *)local_1d0,"<b>");
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this->ResultStrings,(long)(int)line._4_4_);
        poVar7 = std::operator<<(poVar7,(string *)pvVar10);
        std::operator<<(poVar7,"</b> ");
        bVar4 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)
                           lines.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bVar4) ||
           (uVar12 = (ulong)line._4_4_,
           sVar8 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)
                              lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
           sVar8 - 1 < uVar12)) {
          __range1._4_4_ = 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict2 *)((long)&__range1 + 4));
        }
        else {
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)(int)line._4_4_);
          *pvVar13 = *pvVar13 + 1;
        }
        memcheckLine._204_4_ = memcheckLine._204_4_ + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40,local_58);
      lVar6 = std::__cxx11::string::size();
      local_12a8 = local_12a8 + lVar6;
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_40,local_58);
      poVar7 = std::operator<<((ostream *)local_1d0,(string *)pvVar10);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime,&local_58);
    }
  }
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
  i = (size_type)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
  do {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&i);
    if (!bVar4) {
LAB_00234dbc:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1818);
      poVar7 = std::operator<<((ostream *)local_1818,"End test (elapsed: ");
      local_1830.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_1828.__r = (rep)std::chrono::operator-(&local_1830,&local_1108);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_1820,&local_1828);
      uVar5 = cmDurationTo<unsigned_int>(&local_1820);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
      poVar7 = std::operator<<(poVar7,"s)");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x4eb,pcVar9,
                   (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
      std::__cxx11::string::~string(local_1850);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1818);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)log,local_1870);
      std::__cxx11::string::~string(local_1870);
      this->DefectCount = memcheckLine._204_4_ + this->DefectCount;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
                ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                 (local_d98 + 0x10));
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
                ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                 (local_3a0 + 0x10));
      cmsys::RegularExpression::~RegularExpression
                ((RegularExpression *)
                 &matchers.
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&leakExpr.progsize);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return memcheckLine._204_4_ == 0;
    }
    puVar14 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&__end1);
    sVar8 = *puVar14;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40,sVar8);
    lVar6 = std::__cxx11::string::size();
    local_12a8 = local_12a8 + lVar6;
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40,sVar8);
    poVar7 = std::operator<<((ostream *)local_1d0,(string *)pvVar10);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    if (((cc._3_1_ & 1) == 0) &&
       ((ulong)(long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize < local_12a8
       )) {
      std::operator<<((ostream *)local_1d0,"....\n");
      std::operator<<((ostream *)local_1d0,
                      "Test Output for this test has been truncated see testing machine logs for full output,\n"
                     );
      std::operator<<((ostream *)local_1d0,
                      "or put CTEST_FULL_OUTPUT in the output of this test program.\n");
      goto LAB_00234dbc;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  bool unlimitedOutput = false;
  if (str.find("CTEST_FULL_OUTPUT") != std::string::npos ||
      this->CustomMaximumFailedTestOutputSize == 0) {
    unlimitedOutput = true;
  }

  std::string::size_type cc;

  std::ostringstream ostr;
  log.clear();

  int defects = 0;

  cmsys::RegularExpression memcheckLine("^========");

  cmsys::RegularExpression leakExpr("== Leaked [0-9,]+ bytes at");

  // list of matchers for output messages that contain variable content
  // (addresses, sizes, ...) or can be shortened in general. the first match is
  // used as a error name.
  std::vector<cmsys::RegularExpression> matchers{
    // API errors
    "== Malloc/Free error encountered: (.*)",
    "== Program hit error ([^ ]*).* on CUDA API call to",
    "== Program hit ([^ ]*).* on CUDA API call to",
    // memcheck
    "== (Invalid .*) of size [0-9,]+", "== (Fatal UVM [CG]PU fault)",
    // racecheck
    "== .* (Potential .* hazard detected)", "== .* (Race reported)",
    // synccheck
    "== (Barrier error)",
    // initcheck
    "== (Uninitialized .* memory read)", "== (Unused memory)",
    "== (Host API memory access error)",
    // generic error: ignore ERROR SUMMARY, CUDA-MEMCHECK and others
    "== ([A-Z][a-z].*)"
  };
  // matchers for messages that aren't defects, but caught by above matchers
  std::vector<cmsys::RegularExpression> false_positive_matchers{
    "== Error: No attachable process found.*timed-out",
    "== Default timeout can be adjusted with --launch-timeout",
    "== Error: Target application terminated before first instrumented API",
    "== Tracking kernels launched by child processes requires"
  };

  std::vector<std::string::size_type> nonMemcheckOutput;
  auto sttime = std::chrono::steady_clock::now();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::string::size_type totalOutputSize = 0;
  for (cc = 0; cc < lines.size(); cc++) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "test line " << lines[cc] << std::endl, this->Quiet);

    if (memcheckLine.find(lines[cc])) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "cuda sanitizer line " << lines[cc] << std::endl,
                         this->Quiet);
      int failure = -1;
      auto& line = lines[cc];
      if (leakExpr.find(line)) {
        failure = static_cast<int>(this->FindOrAddWarning("Memory leak"));
      } else {
        auto match_predicate =
          [&line](cmsys::RegularExpression& matcher) -> bool {
          return matcher.find(line);
        };
        auto const pos_matcher =
          std::find_if(matchers.begin(), matchers.end(), match_predicate);
        if (pos_matcher != matchers.end()) {
          if (!std::any_of(false_positive_matchers.begin(),
                           false_positive_matchers.end(), match_predicate)) {
            failure =
              static_cast<int>(this->FindOrAddWarning(pos_matcher->match(1)));
          }
        }
      }

      if (failure >= 0) {
        ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
        if (results.empty() ||
            static_cast<unsigned>(failure) > results.size() - 1) {
          results.push_back(1);
        } else {
          results[failure]++;
        }
        defects++;
      }
      totalOutputSize += lines[cc].size();
      ostr << lines[cc] << std::endl;
    } else {
      nonMemcheckOutput.push_back(cc);
    }
  }
  // Now put all all the non cuda sanitizer output into the test output
  // This should be last in case it gets truncated by the output
  // limiting code
  for (std::string::size_type i : nonMemcheckOutput) {
    totalOutputSize += lines[i].size();
    ostr << lines[i] << std::endl;
    if (!unlimitedOutput &&
        totalOutputSize >
          static_cast<size_t>(this->CustomMaximumFailedTestOutputSize)) {
      ostr << "....\n";
      ostr << "Test Output for this test has been truncated see testing"
              " machine logs for full output,\n";
      ostr << "or put CTEST_FULL_OUTPUT in the output of "
              "this test program.\n";
      break; // stop the copy of output if we are full
    }
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}